

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::TypedArrayBase::HasPropertyQuery
          (TypedArrayBase *this,PropertyId propertyId,PropertyValueInfo *info)

{
  uint uVar1;
  bool bVar2;
  BOOL BVar3;
  uint32 uVar4;
  ScriptContext *this_00;
  PropertyRecord *this_01;
  ScriptContext *scriptContext;
  PropertyValueInfo *pPStack_28;
  uint32 index;
  PropertyValueInfo *info_local;
  TypedArrayBase *pTStack_18;
  PropertyId propertyId_local;
  TypedArrayBase *this_local;
  
  scriptContext._4_4_ = 0;
  pPStack_28 = info;
  info_local._4_4_ = propertyId;
  pTStack_18 = this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar3 = ScriptContext::IsNumericPropertyId
                    (this_00,info_local._4_4_,(uint32 *)((long)&scriptContext + 4));
  uVar1 = scriptContext._4_4_;
  if (BVar3 == 0) {
    this_01 = ScriptContext::GetPropertyName(this_00,info_local._4_4_);
    bVar2 = PropertyRecord::IsSymbol(this_01);
    if ((bVar2) || (BVar3 = CanonicalNumericIndexString(info_local._4_4_,this_00), BVar3 == 0)) {
      this_local._4_4_ =
           DynamicObject::HasPropertyQuery((DynamicObject *)this,info_local._4_4_,pPStack_28);
    }
    else {
      this_local._4_4_ = Property_NotFound_NoProto;
    }
  }
  else {
    uVar4 = ArrayObject::GetLength((ArrayObject *)this);
    this_local._4_4_ = Property_NotFound_NoProto;
    if (uVar1 < uVar4) {
      this_local._4_4_ = Property_Found;
    }
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags TypedArrayBase::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        uint32 index = 0;
        ScriptContext *scriptContext = GetScriptContext();
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            // All the slots within the length of the array are valid.
            return index < this->GetLength() ? PropertyQueryFlags::Property_Found : PropertyQueryFlags::Property_NotFound_NoProto;
        }

        if (!scriptContext->GetPropertyName(propertyId)->IsSymbol() && CanonicalNumericIndexString(propertyId, scriptContext))
        {
            return PropertyQueryFlags::Property_NotFound_NoProto;
        }

        return DynamicObject::HasPropertyQuery(propertyId, info);
    }